

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O0

void Fra_SmlAssignDist1(Fra_Sml_t *p,uint *pPat)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Aig_Obj_t *pAVar5;
  uint *p_00;
  int fUseDist1;
  int nTruePis;
  int Limit;
  int k;
  int i;
  int f;
  Aig_Obj_t *pObj;
  uint *pPat_local;
  Fra_Sml_t *p_local;
  
  if (0 < p->nFrames) {
    if (p->nFrames == 1) {
      for (Limit = 0; iVar1 = Vec_PtrSize(p->pAig->vCis), Limit < iVar1; Limit = Limit + 1) {
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,Limit);
        iVar1 = Abc_InfoHasBit(pPat,Limit);
        Fra_SmlAssignConst(p,pAVar5,iVar1,0);
      }
      iVar1 = Aig_ManCiNum(p->pAig);
      iVar1 = Abc_MinInt(iVar1,p->nWordsTotal * 0x20 + -1);
      for (Limit = 0; Limit < iVar1; Limit = Limit + 1) {
        pAVar5 = Aig_ManCi(p->pAig,Limit);
        p_00 = Fra_ObjSim(p,pAVar5->Id);
        Abc_InfoXorBit(p_00,Limit + 1);
      }
    }
    else {
      iVar1 = Aig_ManCiNum(p->pAig);
      iVar2 = Aig_ManRegNum(p->pAig);
      for (k = 0; k < p->nFrames; k = k + 1) {
        Limit = 0;
        while( true ) {
          iVar3 = Aig_ManCiNum(p->pAig);
          iVar4 = Aig_ManRegNum(p->pAig);
          if (iVar3 - iVar4 <= Limit) break;
          pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,Limit);
          iVar3 = Abc_InfoHasBit(pPat,(iVar1 - iVar2) * k + Limit);
          Fra_SmlAssignConst(p,pAVar5,iVar3,k);
          Limit = Limit + 1;
        }
      }
      nTruePis = 0;
      iVar3 = Aig_ManCiNum(p->pAig);
      iVar4 = Aig_ManRegNum(p->pAig);
      for (Limit = iVar3 - iVar4; iVar3 = Vec_PtrSize(p->pAig->vCis), Limit < iVar3;
          Limit = Limit + 1) {
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,Limit);
        iVar3 = Abc_InfoHasBit(pPat,(iVar1 - iVar2) * p->nFrames + nTruePis);
        Fra_SmlAssignConst(p,pAVar5,iVar3,0);
        nTruePis = nTruePis + 1;
      }
    }
    return;
  }
  __assert_fail("p->nFrames > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraSim.c"
                ,0x1b5,"void Fra_SmlAssignDist1(Fra_Sml_t *, unsigned int *)");
}

Assistant:

void Fra_SmlAssignDist1( Fra_Sml_t * p, unsigned * pPat )
{
    Aig_Obj_t * pObj;
    int f, i, k, Limit, nTruePis;
    assert( p->nFrames > 0 );
    if ( p->nFrames == 1 )
    {
        // copy the PI info 
        Aig_ManForEachCi( p->pAig, pObj, i )
            Fra_SmlAssignConst( p, pObj, Abc_InfoHasBit(pPat, i), 0 );
        // flip one bit
        Limit = Abc_MinInt( Aig_ManCiNum(p->pAig), p->nWordsTotal * 32 - 1 );
        for ( i = 0; i < Limit; i++ )
            Abc_InfoXorBit( Fra_ObjSim( p, Aig_ManCi(p->pAig,i)->Id ), i+1 );
    }
    else
    {
        int fUseDist1 = 0;

        // copy the PI info for each frame
        nTruePis = Aig_ManCiNum(p->pAig) - Aig_ManRegNum(p->pAig);
        for ( f = 0; f < p->nFrames; f++ )
            Aig_ManForEachPiSeq( p->pAig, pObj, i )
                Fra_SmlAssignConst( p, pObj, Abc_InfoHasBit(pPat, nTruePis * f + i), f );
        // copy the latch info 
        k = 0;
        Aig_ManForEachLoSeq( p->pAig, pObj, i )
            Fra_SmlAssignConst( p, pObj, Abc_InfoHasBit(pPat, nTruePis * p->nFrames + k++), 0 );
//        assert( p->pManFraig == NULL || nTruePis * p->nFrames + k == Aig_ManCiNum(p->pManFraig) );

        // flip one bit of the last frame
        if ( fUseDist1 ) //&& p->nFrames == 2 )
        {
            Limit = Abc_MinInt( nTruePis, p->nWordsFrame * 32 - 1 );
            for ( i = 0; i < Limit; i++ )
                Abc_InfoXorBit( Fra_ObjSim( p, Aig_ManCi(p->pAig, i)->Id ) + p->nWordsFrame*(p->nFrames-1), i+1 );
        }
    }
}